

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall CLI::ConversionError::ConversionError(ConversionError *this,string *msg)

{
  allocator local_51;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"ConversionError",&local_51);
  ::std::__cxx11::string::string((string *)&local_50,(string *)msg);
  ConversionError(this,&local_30,&local_50,ConversionError);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ConversionError(std::string member, std::string name)
        : ConversionError("The value " + member + " is not an allowed value for " + name) {}